

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::draw(Board *this,RenderTarget *target,RenderStates states)

{
  VertexArray *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  Factor FVar3;
  bool bVar4;
  int iVar5;
  DebugScreen *pDVar6;
  const_iterator cVar7;
  Chunk *pCVar8;
  Vertex *pVVar9;
  long lVar10;
  long lVar11;
  string *this_01;
  Color CVar12;
  ulong uVar13;
  RenderStates *pRVar14;
  RenderStates *pRVar15;
  undefined8 *puVar16;
  int x;
  int iVar17;
  int iVar18;
  size_t index;
  byte bVar19;
  RenderStates in_stack_fffffffffffffe98;
  allocator local_fd;
  float local_fc;
  float local_f8;
  int local_f4;
  float local_f0;
  float local_ec;
  ulong local_e8;
  pair<unsigned_long,_ChunkDrawable> *local_e0;
  string local_d8;
  RenderTarget *local_b8;
  FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *local_b0;
  ulong local_a8;
  Board *local_a0;
  RenderStates states2;
  
  bVar19 = 0;
  iVar5 = LodRenderer::getLevelOfDetail(&this->super_LodRenderer);
  sf::RenderTarget::draw
            (target,(Drawable *)(&(this->chunkRenderCache_).field_0x0 + (long)iVar5 * 0x2f8),&states
            );
  lVar11 = 0xd;
  pRVar14 = &states;
  pRVar15 = &states2;
  for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
    FVar3 = (pRVar14->blendMode).colorDstFactor;
    (pRVar15->blendMode).colorSrcFactor = (pRVar14->blendMode).colorSrcFactor;
    (pRVar15->blendMode).colorDstFactor = FVar3;
    pRVar14 = (RenderStates *)((long)pRVar14 + (ulong)bVar19 * -0x10 + 8);
    pRVar15 = (RenderStates *)((long)pRVar15 + (ulong)bVar19 * -0x10 + 8);
  }
  uVar1 = (this->lastVisibleArea_).left;
  uVar2 = (this->lastVisibleArea_).top;
  local_d8._M_dataplus._M_p =
       (pointer)CONCAT44((float)((uVar2 - (int)(this->lastTopLeft_ >> 0x20)) * 0x400),
                         (float)((uVar1 - (int)this->lastTopLeft_) * 0x400));
  sf::Transform::translate(&states2.transform,(Vector2f *)&local_d8);
  pRVar14 = &states2;
  puVar16 = (undefined8 *)&stack0xfffffffffffffe98;
  for (; lVar11 != 0; lVar11 = lVar11 + -1) {
    *puVar16 = *(undefined8 *)&pRVar14->blendMode;
    pRVar14 = (RenderStates *)((long)pRVar14 + (ulong)bVar19 * -0x10 + 8);
    puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
  }
  local_b8 = target;
  LodRenderer::drawDecorations
            (&this->super_LodRenderer,target,in_stack_fffffffffffffe98,&this->lastVisibleArea_);
  pDVar6 = DebugScreen::instance();
  std::__cxx11::string::string((string *)&local_d8,"Board::draw draw_debug",&local_fd);
  DebugScreen::profilerEvent(pDVar6,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (((this->debugDrawChunkBorder_ == true) && (iVar5 = (this->lastVisibleArea_).width, 0 < iVar5))
     && (iVar17 = (this->lastVisibleArea_).height, 0 < iVar17)) {
    this_00 = &this->debugChunkBorder_;
    sf::VertexArray::resize(this_00,(ulong)(uint)(iVar5 * iVar17 * 4));
    local_a8 = (ulong)(((uint)(this->lastTopLeft_ >> 0x20) ^ 0x7fffffff) +
                       (this->lastVisibleArea_).top + 1);
    local_b0 = &this->chunkDrawables_;
    local_f4 = (~(uint)this->lastTopLeft_ + (this->lastVisibleArea_).left) * 0x400 + 0x400;
    index = 0;
    uVar13 = 0;
    local_a0 = this;
    while (iVar5 = (int)uVar13, iVar5 < (this->lastVisibleArea_).height) {
      local_d8._M_dataplus._M_p =
           (pointer)(CONCAT44((this->lastVisibleArea_).top + iVar5,
                              (this->lastVisibleArea_).left + -1) | 0x8000000080000000);
      cVar7 = FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::upper_bound
                        (local_b0,(unsigned_long *)&local_d8);
      local_f8 = (float)(((int)local_a8 + iVar5) * 0x400);
      local_f0 = local_f8 + 1024.0;
      iVar5 = local_f4;
      local_e8 = uVar13;
      for (iVar17 = 0; iVar17 < (this->lastVisibleArea_).width; iVar17 = iVar17 + 1) {
        CVar12.r = '\0';
        CVar12.g = '\0';
        CVar12.b = 0xff;
        CVar12.a = 0xff;
        local_e0 = cVar7._M_current;
        if ((cVar7._M_current !=
             (this->chunkDrawables_).vec_.
             super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           ((cVar7._M_current)->first ==
            (CONCAT44((this->lastVisibleArea_).top + (int)local_e8,
                      (this->lastVisibleArea_).left + iVar17) | 0x8000000080000000))) {
          pCVar8 = ChunkDrawable::getChunk(&(cVar7._M_current)->second);
          if (pCVar8 == (Chunk *)0x0) {
            CVar12.r = '\0';
            CVar12.g = 0xff;
            CVar12.b = 0xff;
            CVar12.a = 0xff;
          }
          else {
            pCVar8 = ChunkDrawable::getChunk(&(cVar7._M_current)->second);
            bVar4 = Chunk::isUnsaved(pCVar8);
            this_01 = (string *)&sf::Color::Yellow;
            if (bVar4) {
              this_01 = &local_d8;
              sf::Color::Color((Color *)this_01,0xff,'\x7f','\0',0xff);
            }
            CVar12 = *(Color *)&(this_01->_M_dataplus)._M_p;
          }
          local_e0 = local_e0 + 1;
        }
        local_fc = (float)iVar5;
        iVar18 = (int)index;
        pVVar9 = sf::VertexArray::operator[](this_00,index);
        (pVVar9->position).x = local_fc;
        (pVVar9->position).y = local_f8;
        pVVar9 = sf::VertexArray::operator[](this_00,index);
        pVVar9->color = CVar12;
        local_ec = local_fc + 1024.0;
        pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar18 + 1));
        (pVVar9->position).x = local_ec;
        (pVVar9->position).y = local_f8;
        pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar18 + 1));
        pVVar9->color = CVar12;
        pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar18 + 2));
        (pVVar9->position).x = local_fc;
        (pVVar9->position).y = local_f8;
        pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar18 + 2));
        pVVar9->color = CVar12;
        pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar18 + 3));
        (pVVar9->position).x = local_fc;
        (pVVar9->position).y = local_f0;
        pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar18 + 3));
        pVVar9->color = CVar12;
        index = (size_t)(iVar18 + 4);
        iVar5 = iVar5 + 0x400;
        this = local_a0;
        cVar7._M_current = local_e0;
      }
      uVar13 = (ulong)((int)local_e8 + 1);
    }
    sf::RenderTarget::draw(local_b8,&this_00->super_Drawable,&states);
  }
  pDVar6 = DebugScreen::instance();
  std::__cxx11::string::string((string *)&local_d8,"Board::draw draw_debug_done",&local_fd);
  DebugScreen::profilerEvent(pDVar6,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void Board::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    target.draw(chunkRenderCache_[getLevelOfDetail()], states);

    sf::RenderStates states2 = states;
    states2.transform.translate(static_cast<sf::Vector2f>(
        sf::Vector2i(
            lastVisibleArea_.left - ChunkCoords::x(lastTopLeft_),
            lastVisibleArea_.top - ChunkCoords::y(lastTopLeft_)
        ) * Chunk::WIDTH * static_cast<int>(TileWidth::TEXELS)
    ));
    drawDecorations(target, states2, lastVisibleArea_);

    DebugScreen::instance()->profilerEvent("Board::draw draw_debug");
    if (debugDrawChunkBorder_ && lastVisibleArea_.width > 0 && lastVisibleArea_.height > 0) {
        debugChunkBorder_.resize(lastVisibleArea_.width * lastVisibleArea_.height * 4);
        constexpr int chunkWidthTexels = Chunk::WIDTH * static_cast<int>(TileWidth::TEXELS);
        const sf::Vector2i positionOffset = {
            lastVisibleArea_.left - ChunkCoords::x(lastTopLeft_),
            lastVisibleArea_.top - ChunkCoords::y(lastTopLeft_)
        };

        unsigned int i = 0;
        for (int y = 0; y < lastVisibleArea_.height; ++y) {
            auto chunkDrawable = chunkDrawables_.upper_bound(ChunkCoords::pack(lastVisibleArea_.left - 1, lastVisibleArea_.top + y));
            float yChunkPos = static_cast<float>((y + positionOffset.y) * chunkWidthTexels);
            for (int x = 0; x < lastVisibleArea_.width; ++x) {
                float xChunkPos = static_cast<float>((x + positionOffset.x) * chunkWidthTexels);
                sf::Color borderColor = sf::Color::Blue;
                if (chunkDrawable != chunkDrawables_.end() && chunkDrawable->first == ChunkCoords::pack(lastVisibleArea_.left + x, lastVisibleArea_.top + y)) {
                    if (chunkDrawable->second.getChunk() != nullptr) {
                        borderColor = (chunkDrawable->second.getChunk()->isUnsaved() ? sf::Color(255, 127, 0) : sf::Color::Yellow);
                    } else {
                        borderColor = sf::Color::Cyan;
                    }
                    ++chunkDrawable;
                }

                debugChunkBorder_[i + 0].position = {xChunkPos, yChunkPos};
                debugChunkBorder_[i + 0].color = borderColor;
                debugChunkBorder_[i + 1].position = {xChunkPos + chunkWidthTexels, yChunkPos};
                debugChunkBorder_[i + 1].color = borderColor;
                debugChunkBorder_[i + 2].position = {xChunkPos, yChunkPos};
                debugChunkBorder_[i + 2].color = borderColor;
                debugChunkBorder_[i + 3].position = {xChunkPos, yChunkPos + chunkWidthTexels};
                debugChunkBorder_[i + 3].color = borderColor;
                i += 4;
            }
        }
        target.draw(debugChunkBorder_, states);
    }
    DebugScreen::instance()->profilerEvent("Board::draw draw_debug_done");
}